

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::get_annotate_handle_meta(Impl *impl,CallInst *instruction,AnnotateHandleMeta *meta)

{
  bool bVar1;
  ResourceType resource_type;
  ValueKind VVar2;
  uint uVar3;
  uint32_t uVar4;
  Value *pVVar5;
  Instruction *value;
  mapped_type *pmVar6;
  ConstantAggregate *this;
  Constant *pCVar7;
  APInt *pAVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  iterator iVar12;
  uint32_t binding_range_hi;
  uint32_t binding_range_lo;
  __hashtable *__h;
  uint32_t non_uniform_int;
  uint32_t opcode;
  __node_gen_type __node_gen;
  uint32_t local_50;
  Op local_4c;
  CallInst *local_48;
  uint64_t local_40;
  Value *local_38;
  
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  if (pVVar5 == (Value *)0x0) {
    return false;
  }
  value = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar5);
  VVar2 = LLVMBC::Value::get_value_kind((Value *)value);
  if (VVar2 != Call) {
    return false;
  }
  bVar1 = get_constant_operand(value,0,&local_4c);
  if (!bVar1) {
    return false;
  }
  meta->resource_op = local_4c;
  local_50 = 0;
  if (local_4c == CreateHandleForLib) {
    local_48 = (CallInst *)LLVMBC::Instruction::getOperand(value,1);
    iVar12 = std::
             _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)&local_48);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
        ._M_cur == (__node_type *)0x0) {
      return false;
    }
    local_38 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_48 = (CallInst *)&impl->llvm_annotate_handle_lib_uses;
    std::
    _Hashtable<LLVMBC::Value_const*,LLVMBC::Value_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Value_const*>,std::hash<LLVMBC::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<LLVMBC::Value_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<LLVMBC::Value_const*,false>>>>
              ((_Hashtable<LLVMBC::Value_const*,LLVMBC::Value_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Value_const*>,std::hash<LLVMBC::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&impl->llvm_annotate_handle_lib_uses);
    meta->resource_type =
         *(ResourceType *)
          ((long)iVar12.
                 super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                 ._M_cur + 0x10);
    meta->binding_index =
         *(uint32_t *)
          ((long)iVar12.
                 super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                 ._M_cur + 0x14);
    meta->offset = *(Value **)
                    ((long)iVar12.
                           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                           ._M_cur + 0x18);
    local_50 = (uint32_t)
               *(byte *)((long)iVar12.
                               super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                               ._M_cur + 0x28);
    goto LAB_0015f612;
  }
  if (local_4c != CreateHandleFromBinding) {
    if (local_4c != CreateHandleFromHeap) {
      return false;
    }
    local_48 = instruction;
    pmVar6 = std::__detail::
             _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->llvm_annotate_handle_uses,(key_type *)&local_48);
    meta->resource_type = pmVar6->resource_type;
    meta->binding_index = 0xffffffff;
    pVVar5 = LLVMBC::Instruction::getOperand(value,1);
    meta->offset = pVVar5;
    bVar1 = get_constant_operand(value,3,&local_50);
    if (!bVar1) {
      return false;
    }
    goto LAB_0015f612;
  }
  pVVar5 = LLVMBC::Instruction::getOperand(value,2);
  meta->offset = pVVar5;
  bVar1 = get_constant_operand(value,3,&local_50);
  if (!bVar1) {
    return false;
  }
  pVVar5 = LLVMBC::Instruction::getOperand(value,1);
  if (pVVar5 == (Value *)0x0) {
LAB_0015f620:
    pVVar5 = LLVMBC::Instruction::getOperand(value,1);
    pVVar5 = LLVMBC::Internal::resolve_proxy(pVVar5);
    VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
    if (VVar2 != ConstantAggregateZero) {
      return false;
    }
    meta->resource_type = SRV;
    binding_range_lo = 0;
    binding_range_hi = 0;
    uVar4 = 0;
    resource_type = SRV;
  }
  else {
    this = (ConstantAggregate *)LLVMBC::Internal::resolve_proxy(pVVar5);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar2 != ConstantAggregate) goto LAB_0015f620;
    uVar3 = LLVMBC::ConstantAggregate::getNumOperands(this);
    if (uVar3 != 4) {
      return false;
    }
    pCVar7 = LLVMBC::ConstantAggregate::getOperand(this,0);
    pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar7);
    local_40 = LLVMBC::APInt::getZExtValue(pAVar8);
    pCVar7 = LLVMBC::ConstantAggregate::getOperand(this,1);
    pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar7);
    uVar9 = LLVMBC::APInt::getZExtValue(pAVar8);
    pCVar7 = LLVMBC::ConstantAggregate::getOperand(this,2);
    pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar7);
    uVar10 = LLVMBC::APInt::getZExtValue(pAVar8);
    pCVar7 = LLVMBC::ConstantAggregate::getOperand(this,3);
    pAVar8 = LLVMBC::Constant::getUniqueInteger(pCVar7);
    uVar11 = LLVMBC::APInt::getZExtValue(pAVar8);
    resource_type = (ResourceType)uVar11;
    meta->resource_type = resource_type;
    binding_range_lo = (uint32_t)local_40;
    binding_range_hi = (uint32_t)uVar9;
    uVar4 = (uint32_t)uVar10;
  }
  uVar4 = Converter::Impl::find_binding_meta_index
                    (impl,binding_range_lo,binding_range_hi,uVar4,resource_type);
  meta->binding_index = uVar4;
  if (uVar4 == 0xffffffff) {
    return false;
  }
LAB_0015f612:
  meta->non_uniform = local_50 != 0;
  return true;
}

Assistant:

bool get_annotate_handle_meta(Converter::Impl &impl, const llvm::CallInst *instruction,
                              AnnotateHandleMeta &meta)
{
	auto *handle = llvm::dyn_cast<llvm::CallInst>(instruction->getOperand(1));
	if (!handle)
		return false;

	uint32_t opcode;
	if (!get_constant_operand(handle, 0, &opcode))
		return false;

	meta.resource_op = DXIL::Op(opcode);
	uint32_t non_uniform_int = 0;

	if (meta.resource_op == DXIL::Op::CreateHandleFromHeap)
	{
		auto &annotation = impl.llvm_annotate_handle_uses[instruction];
		meta.resource_type = annotation.resource_type;
		meta.binding_index = UINT32_MAX; // Direct heap access.

		meta.offset = handle->getOperand(1);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleFromBinding)
	{
		meta.offset = handle->getOperand(2);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;

		if (auto *res_type = llvm::dyn_cast<llvm::ConstantAggregate>(handle->getOperand(1)))
		{
			if (res_type->getNumOperands() != 4)
				return false;

			uint32_t binding_range_lo = res_type->getOperand(0)->getUniqueInteger().getZExtValue();
			uint32_t binding_range_hi = res_type->getOperand(1)->getUniqueInteger().getZExtValue();
			uint32_t binding_space = res_type->getOperand(2)->getUniqueInteger().getZExtValue();
			meta.resource_type = DXIL::ResourceType(res_type->getOperand(3)->getUniqueInteger().getZExtValue());
			meta.binding_index = impl.find_binding_meta_index(
				binding_range_lo, binding_range_hi,
				binding_space, meta.resource_type);

			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else if (llvm::isa<llvm::ConstantAggregateZero>(handle->getOperand(1)))
		{
			meta.resource_type = DXIL::ResourceType(0);
			meta.binding_index = impl.find_binding_meta_index(0, 0, 0, meta.resource_type);
			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleForLib)
	{
		auto itr = impl.llvm_global_variable_to_resource_mapping.find(handle->getOperand(1));
		if (itr == impl.llvm_global_variable_to_resource_mapping.end())
			return false;

		// Marks that the CreateHandleForLib is a dummy and should not actually emit a resource handle.
		impl.llvm_annotate_handle_lib_uses.insert(instruction->getOperand(1));

		meta.resource_type = itr->second.type;
		meta.binding_index = itr->second.meta_index;
		meta.offset = itr->second.offset;
		non_uniform_int = uint32_t(itr->second.non_uniform);
	}
	else
		return false;

	meta.non_uniform = non_uniform_int != 0;
	return true;
}